

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

bool predictFromScatterData
               (HighsScatterData *scatter_data,double value0,double *predicted_value1,
               bool log_regression)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  
  bVar2 = scatter_data->have_regression_coeff_;
  if (bVar2 == true) {
    if (log_regression) {
      dVar1 = scatter_data->log_coeff0_;
      dVar3 = pow(value0,scatter_data->log_coeff1_);
      dVar3 = dVar3 * dVar1;
    }
    else {
      dVar3 = value0 * scatter_data->linear_coeff1_ + scatter_data->linear_coeff0_;
    }
    *predicted_value1 = dVar3;
  }
  return bVar2;
}

Assistant:

bool predictFromScatterData(const HighsScatterData& scatter_data,
                            const double value0, double& predicted_value1,
                            const bool log_regression) {
  if (!scatter_data.have_regression_coeff_) return false;
  if (log_regression) {
    predicted_value1 =
        scatter_data.log_coeff0_ * pow(value0, scatter_data.log_coeff1_);
    return true;
  } else {
    predicted_value1 =
        scatter_data.linear_coeff0_ + scatter_data.linear_coeff1_ * value0;
    return true;
  }
}